

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
          (SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits)

{
  if (bits.m_int < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x178b,
                  "SafeInt<T, E> &SafeInt<unsigned long>::operator<<=(SafeInt<U, E>) [T = unsigned long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long]"
                 );
  }
  if ((ulong)bits.m_int < 0x40) {
    *(long *)this = *(long *)this << ((byte)bits.m_int & 0x3f);
    return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x178c,
                "SafeInt<T, E> &SafeInt<unsigned long>::operator<<=(SafeInt<U, E>) [T = unsigned long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator <<=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int <<= (U)bits;
        return *this;
    }